

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

void __thiscall
Model::get_schoenberg_grad
          (Model *this,double **g,double label,double alpha,int contextId,int centerId,
          double current_lr)

{
  uint uVar1;
  double **ppdVar2;
  double **ppdVar3;
  double *pdVar4;
  int d_1;
  undefined8 *puVar5;
  int d;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  
  uVar7 = (ulong)this->dim_size;
  uVar6 = -(ulong)(uVar7 == 0) | uVar7 * 8;
  puVar5 = (undefined8 *)operator_new__(uVar6);
  *puVar5 = 0;
  memset(puVar5 + 1,0,uVar6 - 8);
  ppdVar2 = this->emb0;
  ppdVar3 = this->emb1;
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    puVar5[uVar6] = ppdVar3[contextId][uVar6] - ppdVar2[centerId][uVar6];
  }
  dVar9 = 0.0;
  for (uVar6 = 0; uVar7 != uVar6; uVar6 = uVar6 + 1) {
    dVar9 = dVar9 + (double)puVar5[uVar6] * (double)puVar5[uVar6];
  }
  dVar9 = 1.0 / (dVar9 + 1.0);
  dVar8 = pow(dVar9,alpha);
  dVar9 = dVar8 * alpha * dVar9 * ((label - dVar8) + (label - dVar8));
  uVar1 = this->dim_size;
  pdVar4 = *g;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    pdVar4[uVar6] = (double)puVar5[uVar6] * (dVar9 + dVar9);
  }
  pdVar4 = *g;
  for (uVar6 = 0; uVar1 != uVar6; uVar6 = uVar6 + 1) {
    pdVar4[uVar6] = pdVar4[uVar6] * -current_lr;
  }
  operator_delete__(puVar5);
  return;
}

Assistant:

void Model::get_schoenberg_grad(double *&g, double label, double alpha, int contextId, int centerId, double current_lr) {

    double eta, e, scalar_val;
    auto *diff = new double[this->dim_size]{0};


    for (int d = 0; d < this->dim_size; d++)
        diff[d] = this->emb1[contextId][d] - this->emb0[centerId][d]; // (x-y)

    eta = 0.0;
    for (int d = 0; d < this->dim_size; d++)
        eta += diff[d]*diff[d];
    eta = 1.0 + eta;
    eta = 1.0 / eta; // eta = (1 + (x-y)^2 ) ^ {-1}

    e = pow(eta, alpha); // ( 1 + (x-y) )^{-\alpha}
    scalar_val = 2.0 * ( label - e  ) * ( alpha * e * eta ) * ( 2.0 );
    for (int d = 0; d < this->dim_size; d++)
        g[d] =  scalar_val * ( diff[d] );

    for (int d = 0; d < this->dim_size; d++)
        g[d] = -current_lr * g[d]; // minus comes from the objective function, minimization


    delete [] diff;
}